

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiScanlinePartThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_1ad780::testWriteRead(int *pixelTypes,string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  char *__filename;
  long in_RDI;
  int i;
  string typeNames [2];
  string fn;
  string *in_stack_000002e8;
  int *in_stack_000002f0;
  string *in_stack_00000308;
  int *in_stack_00000310;
  string *local_108;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string *local_98;
  int local_7c;
  string local_78 [32];
  string local_58 [32];
  string asStack_38 [8];
  string local_30 [40];
  long local_8;
  
  local_8 = in_RDI;
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_98 = local_78;
  do {
    std::__cxx11::string::string(local_98);
    local_98 = local_98 + 0x20;
  } while (local_98 != asStack_38);
  for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
    iVar1 = *(int *)(local_8 + (long)local_7c * 4);
    if (iVar1 == 0) {
      std::__cxx11::string::operator=(local_78 + (long)local_7c * 0x20,"unsigned int");
    }
    else if (iVar1 == 1) {
      std::__cxx11::string::operator=(local_78 + (long)local_7c * 0x20,"float");
    }
    else if (iVar1 == 2) {
      std::__cxx11::string::operator=(local_78 + (long)local_7c * 0x20,"half");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"part 1: ");
  poVar2 = std::operator<<(poVar2,local_78);
  poVar2 = std::operator<<(poVar2," scanline part, ");
  poVar2 = std::operator<<(poVar2,"part 2: ");
  poVar2 = std::operator<<(poVar2,local_58);
  poVar2 = std::operator<<(poVar2," scanline part. ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  generateFiles(in_stack_000002f0,in_stack_000002e8);
  readFiles(in_stack_00000310,in_stack_00000308);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  local_108 = asStack_38;
  do {
    local_108 = local_108 + -0x20;
    std::__cxx11::string::~string(local_108);
  } while (local_108 != local_78);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testWriteRead (int pixelTypes[], const std::string& tempDir)
{
    std::string fn = tempDir + "imf_test_multi_scanline_part_threading.exr";

    string typeNames[2];
    for (int i = 0; i < 2; i++)
    {
        switch (pixelTypes[i])
        {
            case 0: typeNames[i] = "unsigned int"; break;
            case 1: typeNames[i] = "float"; break;
            case 2: typeNames[i] = "half"; break;
        }
    }
    cout << "part 1: " << typeNames[0] << " scanline part, "
         << "part 2: " << typeNames[1] << " scanline part. " << endl
         << flush;

    generateFiles (pixelTypes, fn);
    readFiles (pixelTypes, fn);

    remove (fn.c_str ());

    cout << endl << flush;
}